

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmParseMumpsCoverage.cxx
# Opt level: O1

bool __thiscall
cmParseMumpsCoverage::FindMumpsFile(cmParseMumpsCoverage *this,string *routine,string *filepath)

{
  pointer pcVar1;
  iterator iVar2;
  long lVar3;
  _Rb_tree_header *p_Var4;
  bool bVar5;
  string routine2;
  key_type local_58;
  string *local_38;
  
  iVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&(this->RoutineToDirectory)._M_t,routine);
  p_Var4 = &(this->RoutineToDirectory)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)iVar2._M_node == p_Var4) {
    lVar3 = 0;
    local_38 = filepath;
    do {
      local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
      pcVar1 = (routine->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_58,pcVar1,pcVar1 + routine->_M_string_length);
      std::__cxx11::string::append((char *)&local_58);
      iVar2 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::find(&(this->RoutineToDirectory)._M_t,&local_58);
      if ((_Rb_tree_header *)iVar2._M_node != p_Var4) {
        std::__cxx11::string::_M_assign((string *)local_38);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p != &local_58.field_2) {
          operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
        }
        goto LAB_0018424d;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
      lVar3 = lVar3 + 8;
      bVar5 = lVar3 != 0x18;
    } while (bVar5);
  }
  else {
    std::__cxx11::string::_M_assign((string *)filepath);
LAB_0018424d:
    bVar5 = true;
  }
  return bVar5;
}

Assistant:

bool cmParseMumpsCoverage::FindMumpsFile(std::string const& routine,
                                         std::string& filepath)
{
  std::map<std::string, std::string>::iterator i =
    this->RoutineToDirectory.find(routine);
  if (i != this->RoutineToDirectory.end()) {
    filepath = i->second;
    return true;
  }
  // try some alternate names
  const char* tryname[] = { "GUX", "GTM", "ONT", nullptr };
  for (int k = 0; tryname[k] != nullptr; k++) {
    std::string routine2 = routine + tryname[k];
    i = this->RoutineToDirectory.find(routine2);
    if (i != this->RoutineToDirectory.end()) {
      filepath = i->second;
      return true;
    }
  }
  return false;
}